

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O0

void __thiscall Nes_Vrc6_Apu::save_state(Nes_Vrc6_Apu *this,vrc6_apu_state_t *out)

{
  int r;
  Vrc6_Osc *osc;
  int i;
  vrc6_apu_state_t *out_local;
  Nes_Vrc6_Apu *this_local;
  
  out->saw_amp = (uint8_t)this->oscs[2].amp;
  for (i = 0; i < 3; i = i + 1) {
    for (r = 0; r < 3; r = r + 1) {
      out->regs[i][r] = this->oscs[i].regs[r];
    }
    out->delays[i] = (uint16_t)this->oscs[i].delay;
    out->phases[i] = (uint8_t)this->oscs[i].phase;
  }
  return;
}

Assistant:

void Nes_Vrc6_Apu::save_state( vrc6_apu_state_t* out ) const
{
	assert( sizeof (vrc6_apu_state_t) == 20 );
	out->saw_amp = oscs [2].amp;
	for ( int i = 0; i < osc_count; i++ )
	{
		Vrc6_Osc const& osc = oscs [i];
		for ( int r = 0; r < reg_count; r++ )
			out->regs [i] [r] = osc.regs [r];
		
		out->delays [i] = osc.delay;
		out->phases [i] = osc.phase;
	}
}